

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectMemory(Wlc_Ntk_t *p,int fClean)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *vTemp;
  Vec_Int_t *vMemObjs;
  Vec_Int_t *vMemSizes;
  int i;
  Wlc_Obj_t *pObj;
  int fClean_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Wlc_NtkCollectMemSizes(p);
  p_01 = Vec_IntAlloc(10);
  for (vMemSizes._4_4_ = 1; iVar1 = Wlc_NtkObjNumMax(p), vMemSizes._4_4_ < iVar1;
      vMemSizes._4_4_ = vMemSizes._4_4_ + 1) {
    pObj_00 = Wlc_NtkObj(p,vMemSizes._4_4_);
    iVar1 = Wlc_ObjType(pObj_00);
    if ((iVar1 == 0x37) || (iVar1 = Wlc_ObjType(pObj_00), iVar1 == 0x36)) {
      Vec_IntPush(p_01,vMemSizes._4_4_);
    }
    else {
      iVar1 = Wlc_ObjRange(pObj_00);
      iVar1 = Vec_IntFind(p_00,iVar1);
      if (-1 < iVar1) {
        Vec_IntPush(p_01,vMemSizes._4_4_);
      }
    }
  }
  Vec_IntFree(p_00);
  Vec_IntSort(p_01,0);
  vTemp = p_01;
  if (fClean != 0) {
    vTemp = Wlc_NtkCleanObjects(p,p_01);
    Vec_IntFree(p_01);
  }
  return vTemp;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemory( Wlc_Ntk_t * p, int fClean )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemSizes = Wlc_NtkCollectMemSizes( p );
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE || Wlc_ObjType(pObj) == WLC_OBJ_READ )
            Vec_IntPush( vMemObjs, i );
        else if ( Vec_IntFind(vMemSizes, Wlc_ObjRange(pObj)) >= 0 )
            Vec_IntPush( vMemObjs, i );
    }
    Vec_IntFree( vMemSizes );
    Vec_IntSort( vMemObjs, 0 );
    //Wlc_NtkPrintNodeArray( p, vMemObjs ); 
    if ( fClean )
    {
        Vec_Int_t * vTemp;
        vMemObjs = Wlc_NtkCleanObjects( p, vTemp = vMemObjs );
        Vec_IntFree( vTemp );
    }
    return vMemObjs;
}